

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

QPDFObjectHandle __thiscall QPDF::getRoot(QPDF *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var3;
  bool bVar4;
  string *psVar5;
  QPDFExc *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  QPDF *in_RSI;
  QPDFObjectHandle QVar7;
  string local_f0;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [128];
  
  _Var3._M_head_impl =
       (in_RSI->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  puVar1 = local_b0 + 0x10;
  local_b0._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/Root","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)&(_Var3._M_head_impl)->trailer);
  if ((undefined1 *)local_b0._0_8_ != puVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
  if (bVar4) {
    _Var6._M_pi = extraout_RDX;
    if (((in_RSI->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->check_mode == true) {
      local_b0._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/Type","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d0,(string *)this);
      paVar2 = &local_f0.field_2;
      local_f0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/Catalog","");
      bVar4 = QPDFObjectHandle::isNameAndEquals((QPDFObjectHandle *)local_d0,&local_f0);
      _Var6._M_pi = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        _Var6._M_pi = extraout_RDX_01;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
        _Var6._M_pi = extraout_RDX_02;
      }
      if ((undefined1 *)local_b0._0_8_ != puVar1) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        _Var6._M_pi = extraout_RDX_03;
      }
      if (!bVar4) {
        local_f0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
        local_d0._0_8_ = (element_type *)local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d0,"catalog /Type entry missing or invalid","");
        psVar5 = (string *)
                 (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                            .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                           _M_head_impl)->file).
                                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                             + 0x18))();
        QPDFExc::QPDFExc((QPDFExc *)local_b0,qpdf_e_damaged_pdf,psVar5,&local_f0,-1,
                         (string *)local_d0,true);
        warn(in_RSI,(QPDFExc *)local_b0);
        QPDFExc::~QPDFExc((QPDFExc *)local_b0);
        if ((element_type *)local_d0._0_8_ != (element_type *)local_c0) {
          operator_delete((void *)local_d0._0_8_,local_c0._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        local_b0._0_8_ = puVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/Type","");
        operator____qpdf((char *)&local_f0,0x25fb27);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)this,(string *)local_b0,(QPDFObjectHandle *)&local_f0);
        _Var6._M_pi = extraout_RDX_04;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_string_length);
          _Var6._M_pi = extraout_RDX_05;
        }
        if ((undefined1 *)local_b0._0_8_ != puVar1) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
          _Var6._M_pi = extraout_RDX_06;
        }
      }
    }
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var6._M_pi;
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (QPDFObjectHandle)
           QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
  local_b0._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"unable to find /Root dictionary","");
  psVar5 = (string *)
           (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x18))();
  QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,psVar5,(string *)local_b0,-1,&local_f0,true);
  __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

QPDFObjectHandle
QPDF::getRoot()
{
    QPDFObjectHandle root = m->trailer.getKey("/Root");
    if (!root.isDictionary()) {
        throw damagedPDF("", -1, "unable to find /Root dictionary");
    } else if (
        // Check_mode is an interim solution to request #810 pending a more comprehensive review of
        // the approach to more extensive checks and warning levels.
        m->check_mode && !root.getKey("/Type").isNameAndEquals("/Catalog")) {
        warn(damagedPDF("", -1, "catalog /Type entry missing or invalid"));
        root.replaceKey("/Type", "/Catalog"_qpdf);
    }
    return root;
}